

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  long *in_RSI;
  long in_RDI;
  SimpleString argument;
  int i;
  bool correctParameters;
  SimpleString *in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffe00;
  byte in_stack_fffffffffffffe04;
  byte in_stack_fffffffffffffe05;
  undefined1 in_stack_fffffffffffffe06;
  byte in_stack_fffffffffffffe07;
  byte in_stack_fffffffffffffe10;
  byte in_stack_fffffffffffffe11;
  byte in_stack_fffffffffffffe12;
  undefined1 in_stack_fffffffffffffe13;
  byte in_stack_fffffffffffffe14;
  byte in_stack_fffffffffffffe15;
  byte in_stack_fffffffffffffe16;
  int *in_stack_fffffffffffffe38;
  char **in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  CommandLineArguments *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  char **in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  CommandLineArguments *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffea0;
  char **in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  CommandLineArguments *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  char **in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  CommandLineArguments *in_stack_fffffffffffffee0;
  char **in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  CommandLineArguments *in_stack_fffffffffffffef8;
  int local_20;
  bool local_19;
  byte local_1;
  
  local_19 = true;
  for (local_20 = 1; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_fffffffffffffe07,
                        CONCAT16(in_stack_fffffffffffffe06,
                                 CONCAT15(in_stack_fffffffffffffe05,
                                          CONCAT14(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00)))),
               (char *)in_stack_fffffffffffffdf8);
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_fffffffffffffe07,
                        CONCAT16(in_stack_fffffffffffffe06,
                                 CONCAT15(in_stack_fffffffffffffe05,
                                          CONCAT14(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00)))),
               (char *)in_stack_fffffffffffffdf8);
    bVar1 = ::operator==((SimpleString *)
                         CONCAT17(in_stack_fffffffffffffe07,
                                  CONCAT16(in_stack_fffffffffffffe06,
                                           CONCAT15(in_stack_fffffffffffffe05,
                                                    CONCAT14(in_stack_fffffffffffffe04,
                                                             in_stack_fffffffffffffe00)))),
                         in_stack_fffffffffffffdf8);
    SimpleString::~SimpleString((SimpleString *)0x18603c);
    if ((bVar1 & 1) == 0) {
      SimpleString::SimpleString
                ((SimpleString *)
                 CONCAT17(in_stack_fffffffffffffe07,
                          CONCAT16(in_stack_fffffffffffffe06,
                                   CONCAT15(in_stack_fffffffffffffe05,
                                            CONCAT14(in_stack_fffffffffffffe04,
                                                     in_stack_fffffffffffffe00)))),
                 (char *)in_stack_fffffffffffffdf8);
      bVar2 = ::operator==((SimpleString *)
                           CONCAT17(in_stack_fffffffffffffe07,
                                    CONCAT16(in_stack_fffffffffffffe06,
                                             CONCAT15(in_stack_fffffffffffffe05,
                                                      CONCAT14(in_stack_fffffffffffffe04,
                                                               in_stack_fffffffffffffe00)))),
                           in_stack_fffffffffffffdf8);
      SimpleString::~SimpleString((SimpleString *)0x1860d9);
      if ((bVar2 & 1) == 0) {
        SimpleString::SimpleString
                  ((SimpleString *)
                   CONCAT17(in_stack_fffffffffffffe07,
                            CONCAT16(in_stack_fffffffffffffe06,
                                     CONCAT15(in_stack_fffffffffffffe05,
                                              CONCAT14(in_stack_fffffffffffffe04,
                                                       in_stack_fffffffffffffe00)))),
                   (char *)in_stack_fffffffffffffdf8);
        bVar3 = ::operator==((SimpleString *)
                             CONCAT17(in_stack_fffffffffffffe07,
                                      CONCAT16(in_stack_fffffffffffffe06,
                                               CONCAT15(in_stack_fffffffffffffe05,
                                                        CONCAT14(in_stack_fffffffffffffe04,
                                                                 in_stack_fffffffffffffe00)))),
                             in_stack_fffffffffffffdf8);
        SimpleString::~SimpleString((SimpleString *)0x186155);
        if ((bVar3 & 1) == 0) {
          SimpleString::SimpleString
                    ((SimpleString *)
                     CONCAT17(in_stack_fffffffffffffe07,
                              CONCAT16(in_stack_fffffffffffffe06,
                                       CONCAT15(in_stack_fffffffffffffe05,
                                                CONCAT14(in_stack_fffffffffffffe04,
                                                         in_stack_fffffffffffffe00)))),
                     (char *)in_stack_fffffffffffffdf8);
          bVar4 = ::operator==((SimpleString *)
                               CONCAT17(in_stack_fffffffffffffe07,
                                        CONCAT16(in_stack_fffffffffffffe06,
                                                 CONCAT15(in_stack_fffffffffffffe05,
                                                          CONCAT14(in_stack_fffffffffffffe04,
                                                                   in_stack_fffffffffffffe00)))),
                               in_stack_fffffffffffffdf8);
          SimpleString::~SimpleString((SimpleString *)0x1861d1);
          if ((bVar4 & 1) == 0) {
            SimpleString::SimpleString
                      ((SimpleString *)
                       CONCAT17(in_stack_fffffffffffffe07,
                                CONCAT16(in_stack_fffffffffffffe06,
                                         CONCAT15(in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                       (char *)in_stack_fffffffffffffdf8);
            bVar5 = ::operator==((SimpleString *)
                                 CONCAT17(in_stack_fffffffffffffe07,
                                          CONCAT16(in_stack_fffffffffffffe06,
                                                   CONCAT15(in_stack_fffffffffffffe05,
                                                            CONCAT14(in_stack_fffffffffffffe04,
                                                                     in_stack_fffffffffffffe00)))),
                                 in_stack_fffffffffffffdf8);
            SimpleString::~SimpleString((SimpleString *)0x18624d);
            if ((bVar5 & 1) == 0) {
              SimpleString::SimpleString
                        ((SimpleString *)
                         CONCAT17(in_stack_fffffffffffffe07,
                                  CONCAT16(in_stack_fffffffffffffe06,
                                           CONCAT15(in_stack_fffffffffffffe05,
                                                    CONCAT14(in_stack_fffffffffffffe04,
                                                             in_stack_fffffffffffffe00)))),
                         (char *)in_stack_fffffffffffffdf8);
              bVar6 = ::operator==((SimpleString *)
                                   CONCAT17(in_stack_fffffffffffffe07,
                                            CONCAT16(in_stack_fffffffffffffe06,
                                                     CONCAT15(in_stack_fffffffffffffe05,
                                                              CONCAT14(in_stack_fffffffffffffe04,
                                                                       in_stack_fffffffffffffe00))))
                                   ,in_stack_fffffffffffffdf8);
              SimpleString::~SimpleString((SimpleString *)0x1862c9);
              if ((bVar6 & 1) == 0) {
                SimpleString::SimpleString
                          ((SimpleString *)
                           CONCAT17(in_stack_fffffffffffffe07,
                                    CONCAT16(in_stack_fffffffffffffe06,
                                             CONCAT15(in_stack_fffffffffffffe05,
                                                      CONCAT14(in_stack_fffffffffffffe04,
                                                               in_stack_fffffffffffffe00)))),
                           (char *)in_stack_fffffffffffffdf8);
                bVar7 = ::operator==((SimpleString *)
                                     CONCAT17(in_stack_fffffffffffffe07,
                                              CONCAT16(in_stack_fffffffffffffe06,
                                                       CONCAT15(in_stack_fffffffffffffe05,
                                                                CONCAT14(in_stack_fffffffffffffe04,
                                                                         in_stack_fffffffffffffe00))
                                                      )),in_stack_fffffffffffffdf8);
                SimpleString::~SimpleString((SimpleString *)0x186345);
                if ((bVar7 & 1) == 0) {
                  SimpleString::SimpleString
                            ((SimpleString *)
                             CONCAT17(in_stack_fffffffffffffe07,
                                      CONCAT16(in_stack_fffffffffffffe06,
                                               CONCAT15(in_stack_fffffffffffffe05,
                                                        CONCAT14(in_stack_fffffffffffffe04,
                                                                 in_stack_fffffffffffffe00)))),
                             (char *)in_stack_fffffffffffffdf8);
                  bVar8 = ::operator==((SimpleString *)
                                       CONCAT17(in_stack_fffffffffffffe07,
                                                CONCAT16(in_stack_fffffffffffffe06,
                                                         CONCAT15(in_stack_fffffffffffffe05,
                                                                  CONCAT14(in_stack_fffffffffffffe04
                                                                           ,
                                                  in_stack_fffffffffffffe00)))),
                                       in_stack_fffffffffffffdf8);
                  SimpleString::~SimpleString((SimpleString *)0x1863c1);
                  if ((bVar8 & 1) == 0) {
                    SimpleString::SimpleString
                              ((SimpleString *)
                               CONCAT17(in_stack_fffffffffffffe07,
                                        CONCAT16(in_stack_fffffffffffffe06,
                                                 CONCAT15(in_stack_fffffffffffffe05,
                                                          CONCAT14(in_stack_fffffffffffffe04,
                                                                   in_stack_fffffffffffffe00)))),
                               (char *)in_stack_fffffffffffffdf8);
                    bVar9 = ::operator==((SimpleString *)
                                         CONCAT17(in_stack_fffffffffffffe07,
                                                  CONCAT16(in_stack_fffffffffffffe06,
                                                           CONCAT15(in_stack_fffffffffffffe05,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                         in_stack_fffffffffffffdf8);
                    SimpleString::~SimpleString((SimpleString *)0x18643d);
                    if ((bVar9 & 1) == 0) {
                      SimpleString::SimpleString
                                ((SimpleString *)
                                 CONCAT17(in_stack_fffffffffffffe07,
                                          CONCAT16(in_stack_fffffffffffffe06,
                                                   CONCAT15(in_stack_fffffffffffffe05,
                                                            CONCAT14(in_stack_fffffffffffffe04,
                                                                     in_stack_fffffffffffffe00)))),
                                 (char *)in_stack_fffffffffffffdf8);
                      in_stack_fffffffffffffe16 =
                           SimpleString::startsWith
                                     ((SimpleString *)
                                      CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,
                                                  CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7,bVar8
                                                                                        ))))))),
                                      (SimpleString *)
                                      CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                              CONCAT15(in_stack_fffffffffffffe15,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffe14,
                                                  CONCAT13(in_stack_fffffffffffffe13,
                                                           CONCAT12(in_stack_fffffffffffffe12,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))));
                      SimpleString::~SimpleString((SimpleString *)0x1864b9);
                      if ((in_stack_fffffffffffffe16 & 1) == 0) {
                        SimpleString::SimpleString
                                  ((SimpleString *)
                                   CONCAT17(in_stack_fffffffffffffe07,
                                            CONCAT16(in_stack_fffffffffffffe06,
                                                     CONCAT15(in_stack_fffffffffffffe05,
                                                              CONCAT14(in_stack_fffffffffffffe04,
                                                                       in_stack_fffffffffffffe00))))
                                   ,(char *)in_stack_fffffffffffffdf8);
                        in_stack_fffffffffffffe15 =
                             SimpleString::startsWith
                                       ((SimpleString *)
                                        CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,
                                                  CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7,bVar8
                                                                                        ))))))),
                                        (SimpleString *)
                                        CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                CONCAT15(in_stack_fffffffffffffe15,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffe14,
                                                  CONCAT13(in_stack_fffffffffffffe13,
                                                           CONCAT12(in_stack_fffffffffffffe12,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))));
                        SimpleString::~SimpleString((SimpleString *)0x186547);
                        if ((in_stack_fffffffffffffe15 & 1) == 0) {
                          SimpleString::SimpleString
                                    ((SimpleString *)
                                     CONCAT17(in_stack_fffffffffffffe07,
                                              CONCAT16(in_stack_fffffffffffffe06,
                                                       CONCAT15(in_stack_fffffffffffffe05,
                                                                CONCAT14(in_stack_fffffffffffffe04,
                                                                         in_stack_fffffffffffffe00))
                                                      )),(char *)in_stack_fffffffffffffdf8);
                          in_stack_fffffffffffffe14 =
                               SimpleString::startsWith
                                         ((SimpleString *)
                                          CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                          (SimpleString *)
                                          CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                  CONCAT15(in_stack_fffffffffffffe15
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffe14,
                                                  CONCAT13(in_stack_fffffffffffffe13,
                                                           CONCAT12(in_stack_fffffffffffffe12,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffe11,
                                                  in_stack_fffffffffffffe10))))))));
                          SimpleString::~SimpleString((SimpleString *)0x1865d5);
                          if ((in_stack_fffffffffffffe14 & 1) == 0) {
                            SimpleString::SimpleString
                                      ((SimpleString *)
                                       CONCAT17(in_stack_fffffffffffffe07,
                                                CONCAT16(in_stack_fffffffffffffe06,
                                                         CONCAT15(in_stack_fffffffffffffe05,
                                                                  CONCAT14(in_stack_fffffffffffffe04
                                                                           ,
                                                  in_stack_fffffffffffffe00)))),
                                       (char *)in_stack_fffffffffffffdf8);
                            in_stack_fffffffffffffe12 =
                                 SimpleString::startsWith
                                           ((SimpleString *)
                                            CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                            (SimpleString *)
                                            CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                            SimpleString::~SimpleString((SimpleString *)0x186674);
                            if ((in_stack_fffffffffffffe12 & 1) == 0) {
                              SimpleString::SimpleString
                                        ((SimpleString *)
                                         CONCAT17(in_stack_fffffffffffffe07,
                                                  CONCAT16(in_stack_fffffffffffffe06,
                                                           CONCAT15(in_stack_fffffffffffffe05,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                         (char *)in_stack_fffffffffffffdf8);
                              in_stack_fffffffffffffe11 =
                                   SimpleString::startsWith
                                             ((SimpleString *)
                                              CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  bVar4,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(bVar7
                                                  ,bVar8))))))),
                                              (SimpleString *)
                                              CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                              SimpleString::~SimpleString((SimpleString *)0x186702);
                              if ((in_stack_fffffffffffffe11 & 1) == 0) {
                                SimpleString::SimpleString
                                          ((SimpleString *)
                                           CONCAT17(in_stack_fffffffffffffe07,
                                                    CONCAT16(in_stack_fffffffffffffe06,
                                                             CONCAT15(in_stack_fffffffffffffe05,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                           (char *)in_stack_fffffffffffffdf8);
                                in_stack_fffffffffffffe10 =
                                     SimpleString::startsWith
                                               ((SimpleString *)
                                                CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,
                                                  CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                (SimpleString *)
                                                CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                        CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                SimpleString::~SimpleString((SimpleString *)0x186790);
                                if ((in_stack_fffffffffffffe10 & 1) == 0) {
                                  SimpleString::SimpleString
                                            ((SimpleString *)
                                             CONCAT17(in_stack_fffffffffffffe07,
                                                      CONCAT16(in_stack_fffffffffffffe06,
                                                               CONCAT15(in_stack_fffffffffffffe05,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                             (char *)in_stack_fffffffffffffdf8);
                                  bVar10 = SimpleString::startsWith
                                                     ((SimpleString *)
                                                      CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,
                                                  CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                  SimpleString::~SimpleString((SimpleString *)0x18681e);
                                  if (bVar10) {
                                    addNameFilter(in_stack_fffffffffffffe70,
                                                  in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe60,
                                                  in_stack_fffffffffffffe58);
                                  }
                                  else {
                                    SimpleString::SimpleString
                                              ((SimpleString *)
                                               CONCAT17(in_stack_fffffffffffffe07,
                                                        CONCAT16(in_stack_fffffffffffffe06,
                                                                 CONCAT15(in_stack_fffffffffffffe05,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                               (char *)in_stack_fffffffffffffdf8);
                                    bVar10 = SimpleString::startsWith
                                                       ((SimpleString *)
                                                        CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3
                                                  ,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6,
                                                  CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                    SimpleString::~SimpleString((SimpleString *)0x1868ac);
                                    if (bVar10) {
                                      addStrictNameFilter(in_stack_fffffffffffffe70,
                                                          in_stack_fffffffffffffe6c,
                                                          in_stack_fffffffffffffe60,
                                                          in_stack_fffffffffffffe58);
                                    }
                                    else {
                                      SimpleString::SimpleString
                                                ((SimpleString *)
                                                 CONCAT17(in_stack_fffffffffffffe07,
                                                          CONCAT16(in_stack_fffffffffffffe06,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                                                 (char *)in_stack_fffffffffffffdf8);
                                      bVar10 = SimpleString::startsWith
                                                         ((SimpleString *)
                                                          CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6
                                                  ,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                      SimpleString::~SimpleString((SimpleString *)0x18693a);
                                      if (bVar10) {
                                        addExcludeNameFilter
                                                  (in_stack_fffffffffffffe70,
                                                   in_stack_fffffffffffffe6c,
                                                   in_stack_fffffffffffffe60,
                                                   in_stack_fffffffffffffe58);
                                      }
                                      else {
                                        SimpleString::SimpleString
                                                  ((SimpleString *)
                                                   CONCAT17(in_stack_fffffffffffffe07,
                                                            CONCAT16(in_stack_fffffffffffffe06,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                        bVar10 = SimpleString::startsWith
                                                           ((SimpleString *)
                                                            CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(bVar6
                                                  ,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                        SimpleString::~SimpleString((SimpleString *)0x1869c8);
                                        if (bVar10) {
                                          addExcludeStrictNameFilter
                                                    (in_stack_fffffffffffffe70,
                                                     in_stack_fffffffffffffe6c,
                                                     in_stack_fffffffffffffe60,
                                                     in_stack_fffffffffffffe58);
                                        }
                                        else {
                                          SimpleString::SimpleString
                                                    ((SimpleString *)
                                                     CONCAT17(in_stack_fffffffffffffe07,
                                                              CONCAT16(in_stack_fffffffffffffe06,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                          bVar10 = SimpleString::startsWith
                                                             ((SimpleString *)
                                                              CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15
                                                  (bVar3,CONCAT14(bVar4,CONCAT13(bVar5,CONCAT12(
                                                  bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                          SimpleString::~SimpleString((SimpleString *)0x186a56);
                                          if (bVar10) {
                                            local_19 = setShuffle(in_stack_fffffffffffffe50,
                                                                  in_stack_fffffffffffffe4c,
                                                                  in_stack_fffffffffffffe40,
                                                                  in_stack_fffffffffffffe38);
                                          }
                                          else {
                                            SimpleString::SimpleString
                                                      ((SimpleString *)
                                                       CONCAT17(in_stack_fffffffffffffe07,
                                                                CONCAT16(in_stack_fffffffffffffe06,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                            bVar10 = SimpleString::startsWith
                                                               ((SimpleString *)
                                                                CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                            SimpleString::~SimpleString((SimpleString *)0x186aec);
                                            if (bVar10) {
                                              addTestToRunBasedOnVerboseOutput
                                                        (in_stack_fffffffffffffee0,
                                                         in_stack_fffffffffffffedc,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8,
                                                         in_stack_fffffffffffffec0);
                                            }
                                            else {
                                              SimpleString::SimpleString
                                                        ((SimpleString *)
                                                         CONCAT17(in_stack_fffffffffffffe07,
                                                                  CONCAT16(in_stack_fffffffffffffe06
                                                                           ,CONCAT15(
                                                  in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                              bVar10 = SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                              SimpleString::~SimpleString((SimpleString *)0x186b75);
                                              if (bVar10) {
                                                addTestToRunBasedOnVerboseOutput
                                                          (in_stack_fffffffffffffee0,
                                                           in_stack_fffffffffffffedc,
                                                           in_stack_fffffffffffffed0,
                                                           in_stack_fffffffffffffec8,
                                                           in_stack_fffffffffffffec0);
                                              }
                                              else {
                                                SimpleString::SimpleString
                                                          ((SimpleString *)
                                                           CONCAT17(in_stack_fffffffffffffe07,
                                                                    CONCAT16(
                                                  in_stack_fffffffffffffe06,
                                                  CONCAT15(in_stack_fffffffffffffe05,
                                                           CONCAT14(in_stack_fffffffffffffe04,
                                                                    in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                                in_stack_fffffffffffffe07 =
                                                     SimpleString::startsWith
                                                               ((SimpleString *)
                                                                CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                                SimpleString::~SimpleString
                                                          ((SimpleString *)0x186bfe);
                                                if ((in_stack_fffffffffffffe07 & 1) == 0) {
                                                  SimpleString::SimpleString
                                                            ((SimpleString *)
                                                             CONCAT17(in_stack_fffffffffffffe07,
                                                                      CONCAT16(
                                                  in_stack_fffffffffffffe06,
                                                  CONCAT15(in_stack_fffffffffffffe05,
                                                           CONCAT14(in_stack_fffffffffffffe04,
                                                                    in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                                  in_stack_fffffffffffffe05 =
                                                       SimpleString::startsWith
                                                                 ((SimpleString *)
                                                                  CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x186c91);
                                                  if ((in_stack_fffffffffffffe05 & 1) == 0) {
                                                    SimpleString::SimpleString
                                                              ((SimpleString *)
                                                               CONCAT17(in_stack_fffffffffffffe07,
                                                                        CONCAT16(
                                                  in_stack_fffffffffffffe06,
                                                  CONCAT15(in_stack_fffffffffffffe05,
                                                           CONCAT14(in_stack_fffffffffffffe04,
                                                                    in_stack_fffffffffffffe00)))),
                                                  (char *)in_stack_fffffffffffffdf8);
                                                  bVar10 = SimpleString::startsWith
                                                                     ((SimpleString *)
                                                                      CONCAT17(bVar1,CONCAT16(bVar2,
                                                  CONCAT15(bVar3,CONCAT14(bVar4,CONCAT13(bVar5,
                                                  CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))),
                                                  (SimpleString *)
                                                  CONCAT17(bVar9,CONCAT16(in_stack_fffffffffffffe16,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffe15,
                                                  CONCAT14(in_stack_fffffffffffffe14,
                                                           CONCAT13(in_stack_fffffffffffffe13,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffe12,
                                                  CONCAT11(in_stack_fffffffffffffe11,
                                                           in_stack_fffffffffffffe10))))))));
                                                  in_stack_fffffffffffffe00 =
                                                       CONCAT13(bVar10,(int3)
                                                  in_stack_fffffffffffffe00);
                                                  SimpleString::~SimpleString
                                                            ((SimpleString *)0x186d2f);
                                                  if ((in_stack_fffffffffffffe00 & 0x1000000) == 0)
                                                  {
                                                    local_19 = false;
                                                  }
                                                  else {
                                                    setPackageName(in_stack_fffffffffffffe70,
                                                                   in_stack_fffffffffffffe6c,
                                                                   in_stack_fffffffffffffe60,
                                                                   in_stack_fffffffffffffe58);
                                                  }
                                                  }
                                                  else {
                                                    in_stack_fffffffffffffe04 =
                                                         (**(code **)(*in_RSI + 0x38))
                                                                   (in_RSI,*(undefined4 *)
                                                                            (in_RDI + 8),
                                                                    *(undefined8 *)(in_RDI + 0x10),
                                                                    local_20);
                                                    local_19 = (bool)(in_stack_fffffffffffffe04 & 1)
                                                    ;
                                                  }
                                                }
                                                else {
                                                  in_stack_fffffffffffffe06 =
                                                       setOutputType(in_stack_fffffffffffffeb8,
                                                                     in_stack_fffffffffffffeb4,
                                                                     in_stack_fffffffffffffea8,
                                                                     in_stack_fffffffffffffea0);
                                                  local_19 = (bool)in_stack_fffffffffffffe06;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  addExcludeStrictGroupFilter
                                            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                                }
                              }
                              else {
                                addExcludeGroupFilter
                                          (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                           in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                              }
                            }
                            else {
                              addStrictGroupFilter
                                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                         in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                            }
                          }
                          else {
                            in_stack_fffffffffffffe13 =
                                 addGroupDotNameFilter
                                           (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                            in_stack_fffffffffffffee8,
                                            (int *)in_stack_fffffffffffffee0);
                            local_19 = (bool)in_stack_fffffffffffffe13;
                          }
                        }
                        else {
                          addGroupFilter(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                         in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                        }
                      }
                      else {
                        setRepeatCount(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                      }
                    }
                    else {
                      *(undefined1 *)(in_RDI + 0x1f) = 1;
                    }
                  }
                  else {
                    *(undefined1 *)(in_RDI + 0x1e) = 1;
                  }
                }
                else {
                  *(undefined1 *)(in_RDI + 0x1d) = 1;
                }
              }
              else {
                *(undefined1 *)(in_RDI + 0x20) = 1;
              }
            }
            else {
              *(undefined1 *)(in_RDI + 0x1c) = 1;
            }
          }
          else {
            *(undefined1 *)(in_RDI + 0x1b) = 1;
          }
        }
        else {
          *(undefined1 *)(in_RDI + 0x1a) = 1;
        }
      }
      else {
        *(undefined1 *)(in_RDI + 0x19) = 1;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x18) = 1;
      local_19 = false;
    }
    if (local_19 == false) {
      local_1 = 0;
    }
    SimpleString::~SimpleString((SimpleString *)0x186de9);
    if (local_19 == false) goto LAB_00186e24;
  }
  local_1 = 1;
LAB_00186e24:
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if (argument == "-h") {
            needHelp_ = true;
            correctParameters = false;
        }
        else if (argument == "-v") verbose_ = true;
        else if (argument == "-vv") veryVerbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-b") reversing_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) setRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) addGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-t")) correctParameters = addGroupDotNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) addStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) addExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) addExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) addNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) addStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) addExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) addExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-s")) correctParameters = setShuffle(ac_, av_, i);
        else if (argument.startsWith("TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = setOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) setPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}